

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zm.c
# Opt level: O0

void zmCreateMont(qr_o *r,octet *mod,size_t no,void *stack)

{
  u64 uVar1;
  size_t sVar2;
  size_t sVar3;
  size_t sVar4;
  size_t sVar5;
  size_t sVar6;
  size_t sVar7;
  void *in_RDX;
  size_t in_RSI;
  word *in_RDI;
  size_t unaff_retaddr;
  word *in_stack_00000008;
  word *in_stack_00000010;
  void *in_stack_ffffffffffffffa8;
  u64 *in_stack_ffffffffffffffb0;
  
  in_RDI[6] = (long)in_RDX + 7U >> 3;
  in_RDI[7] = (word)in_RDX;
  in_RDI[3] = (word)(in_RDI + 0x12);
  u64From(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,0x16a4cd);
  in_RDI[4] = in_RDI[3] + in_RDI[6] * 8;
  wwSetZero((word *)in_RDI[4],in_RDI[6]);
  zzSub2((word *)in_RDI[4],(word *)in_RDI[3],in_RDI[6]);
  zzMod(in_stack_00000010,in_stack_00000008,unaff_retaddr,in_RDI,in_RSI,in_RDX);
  in_RDI[5] = in_RDI[4] + in_RDI[6] * 8;
  uVar1 = u64NegInv(*(u64 *)in_RDI[3]);
  *(u64 *)in_RDI[5] = uVar1;
  in_RDI[8] = (word)zmFromMont;
  in_RDI[9] = (word)zmToMont;
  in_RDI[10] = (word)zmAdd2;
  in_RDI[0xb] = (word)zmSub2;
  in_RDI[0xc] = (word)zmNeg2;
  in_RDI[0xd] = (word)zmMulMont;
  in_RDI[0xe] = (word)zmSqrMont;
  in_RDI[0xf] = (word)zmInvMont;
  in_RDI[0x10] = (word)zmDivMont;
  sVar2 = zmFromMont_deep((size_t)in_stack_ffffffffffffffb0);
  sVar3 = zmToMont_deep((size_t)in_stack_ffffffffffffffb0);
  sVar4 = zmMulMont_deep((size_t)in_stack_ffffffffffffffb0);
  sVar5 = zmSqrMont_deep((size_t)in_stack_ffffffffffffffb0);
  sVar6 = zmInvMont_deep(0x16a68c);
  sVar7 = zmDivMont_deep((size_t)in_stack_ffffffffffffffb0);
  sVar2 = utilMax(6,sVar2,sVar3,sVar4,sVar5,sVar6,sVar7);
  in_RDI[0x11] = sVar2;
  *in_RDI = (in_RDI[6] * 2 + 1) * 8 + 0x90;
  in_RDI[1] = 3;
  in_RDI[2] = 0;
  return;
}

Assistant:

void zmCreateMont(qr_o* r, const octet mod[], size_t no, void* stack)
{
	ASSERT(memIsValid(r, sizeof(qr_o)));
	ASSERT(memIsValid(mod, no));
	ASSERT(no > 0 && mod[no - 1] > 0);
	ASSERT(mod[0] % 2 != 0);
	// зафиксировать размерности
	r->n = W_OF_O(no);
	r->no = no;
	// зафиксировать модуль
	r->mod = (word*)r->descr;
	wwFrom(r->mod, mod, no);
	// подготовить единицу
	r->unity = r->mod + r->n;
	wwSetZero(r->unity, r->n);
	zzSub2(r->unity, r->mod, r->n);
	zzMod(r->unity, r->unity, r->n, r->mod, r->n, stack);
	// подготовить параметры
	r->params = r->unity + r->n;
	*((word*)r->params) = wordNegInv(r->mod[0]);
	// настроить функции
	r->from = zmFromMont;
	r->to = zmToMont;
	r->add = zmAdd2;
	r->sub = zmSub2;
	r->neg = zmNeg2;
	r->mul = zmMulMont;
	r->sqr = zmSqrMont;
	r->inv = zmInvMont;
	r->div = zmDivMont;
	r->deep = utilMax(6,
		zmFromMont_deep(r->n),
		zmToMont_deep(r->n),
		zmMulMont_deep(r->n),
		zmSqrMont_deep(r->n),
		zmInvMont_deep(r->n),
		zmDivMont_deep(r->n));
	// настроить заголовок
	r->hdr.keep = sizeof(qr_o) + O_OF_W(2 * r->n + 1);
	r->hdr.p_count = 3;
	r->hdr.o_count = 0;
}